

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O2

int ffgtbb(fitsfile *fptr,LONGLONG firstrow,LONGLONG firstchar,LONGLONG nchars,uchar *values,
          int *status)

{
  FITSfile *pFVar1;
  
  if (nchars < 1 || 0 < *status) {
    return *status;
  }
  if (0 < firstrow) {
    if (firstchar < 1) {
      *status = 0x134;
      return 0x134;
    }
    pFVar1 = fptr->Fptr;
    if (fptr->HDUposition != pFVar1->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
      pFVar1 = fptr->Fptr;
    }
    if ((nchars + firstchar + -2) / pFVar1->rowlength + firstrow <= pFVar1->numrows) {
      ffmbyt(fptr,pFVar1->datastart + firstchar + pFVar1->rowlength * (firstrow + -1) + -1,0,status)
      ;
      ffgbyt(fptr,nchars,values,status);
      return *status;
    }
    ffpmsg("attempt to read past end of table (ffgtbb)");
  }
  *status = 0x133;
  return 0x133;
}

Assistant:

int ffgtbb(fitsfile *fptr,        /* I - FITS file pointer                 */
           LONGLONG firstrow,         /* I - starting row (1 = first row)      */
           LONGLONG firstchar,        /* I - starting byte in row (1=first)    */
           LONGLONG nchars,           /* I - number of bytes to read           */
           unsigned char *values, /* I - array of bytes to read            */
           int *status)           /* IO - error status                     */
/*
  read a consecutive string of bytes from an ascii or binary table.
  This will span multiple rows of the table if nchars + firstchar is
  greater than the length of a row.
*/
{
    LONGLONG bytepos, endrow;

    if (*status > 0 || nchars <= 0)
        return(*status);

    else if (firstrow < 1)
        return(*status=BAD_ROW_NUM);

    else if (firstchar < 1)
        return(*status=BAD_ELEM_NUM);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* check that we do not exceed number of rows in the table */
    endrow = ((firstchar + nchars - 2) / (fptr->Fptr)->rowlength) + firstrow;
    if (endrow > (fptr->Fptr)->numrows)
    {
        ffpmsg("attempt to read past end of table (ffgtbb)");
        return(*status=BAD_ROW_NUM);
    }

    /* move the i/o pointer to the start of the sequence of characters */
    bytepos = (fptr->Fptr)->datastart +
              ((fptr->Fptr)->rowlength * (firstrow - 1)) +
              firstchar - 1;

    ffmbyt(fptr, bytepos, REPORT_EOF, status);
    ffgbyt(fptr, nchars, values, status);  /* read the bytes */

    return(*status);
}